

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it;
  const_iterator f;
  const_iterator l;
  bool bVar1;
  value_type vVar2;
  reference piVar3;
  _Rb_tree_const_iterator<int> _Var4;
  undefined1 uVar5;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  const_iterator set_end;
  const_iterator set_begin;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator begin;
  set<int,_std::less<int>,_std::allocator<int>_> set_input;
  value_type input [4];
  TypeParam ht_source;
  undefined4 uVar7;
  int in_stack_fffffffffffff94c;
  int iVar8;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff950;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  allocator_type *in_stack_fffffffffffff960;
  _Rb_tree_const_iterator<int> f_00;
  key_equal *in_stack_fffffffffffff968;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *lhs_expression;
  const_iterator *in_stack_fffffffffffff970;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *__i;
  size_type in_stack_fffffffffffff978;
  _Base_ptr p_Var9;
  Type type;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff980;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  value_type in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  value_type in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  value_type in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  value_type in_stack_fffffffffffff9d0;
  int in_stack_fffffffffffff9d4;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  undefined4 in_stack_fffffffffffff9e0;
  int iVar10;
  undefined4 in_stack_fffffffffffff9e4;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa0c;
  undefined4 uVar11;
  AssertionResult local_508 [2];
  size_type local_4e8;
  undefined4 local_4dc;
  AssertionResult local_4d8;
  _Base_ptr local_4c8;
  _Base_ptr local_4c0;
  _Base_ptr local_4b8;
  _Rb_tree_const_iterator<int> local_4b0;
  _Rb_tree_const_iterator<int> local_4a8;
  string local_4a0 [48];
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_470;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_450;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_430;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_410;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3f0;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3d0;
  undefined1 local_3a9;
  AssertionResult local_3a8 [2];
  size_type local_388;
  undefined4 local_37c;
  AssertionResult local_378;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_368;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_360;
  _Base_ptr local_358;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_350;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_348;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_340;
  _Base_ptr local_338;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_330;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_328;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_320;
  _Base_ptr local_318;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  pointer local_2f8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_2f0;
  const_iterator local_2e8;
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  value_type local_2b4;
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  value_type local_29c;
  _Base_ptr local_298;
  undefined1 local_290;
  value_type local_284;
  _Base_ptr local_280;
  undefined1 local_278;
  value_type local_26c;
  _Base_ptr local_268;
  undefined1 local_260;
  value_type local_254;
  _Base_ptr local_250;
  undefined1 local_248;
  value_type local_23c;
  dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_208;
  int local_1e8;
  value_type local_1e4;
  value_type local_1e0;
  value_type local_1dc;
  value_type local_1ac;
  value_type local_17c;
  value_type local_14c;
  value_type local_11c;
  value_type local_ec;
  value_type local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94 [12];
  
  Hasher::Hasher(local_94,0);
  Hasher::Hasher(&local_a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,(hasher *)in_stack_fffffffffffff970
             ,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  local_c0 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_ec = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_11c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_14c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_17c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  local_1ac = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
           (value_type *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff990);
  piVar3 = google::
           dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_208);
  local_1e8 = *piVar3;
  local_1e4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  local_1e0 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  local_1dc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xe44d89);
  local_23c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     &in_stack_fffffffffffff968->id_);
  local_250 = (_Base_ptr)pVar6.first._M_node;
  local_248 = pVar6.second;
  local_254 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     &in_stack_fffffffffffff968->id_);
  local_268 = (_Base_ptr)pVar6.first._M_node;
  local_260 = pVar6.second;
  local_26c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     &in_stack_fffffffffffff968->id_);
  local_280 = (_Base_ptr)pVar6.first._M_node;
  local_278 = pVar6.second;
  local_284 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     &in_stack_fffffffffffff968->id_);
  local_298 = (_Base_ptr)pVar6.first._M_node;
  local_290 = pVar6.second;
  local_29c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     &in_stack_fffffffffffff968->id_);
  local_2b0 = (_Base_ptr)pVar6.first._M_node;
  local_2a8 = pVar6.second;
  uVar11 = CONCAT13(local_2a8,(int3)in_stack_fffffffffffffa0c);
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  local_2b4 = vVar2;
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     &in_stack_fffffffffffff968->id_);
  iVar8 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
  _Var4 = pVar6.first._M_node;
  uVar5 = pVar6.second;
  local_2c8 = _Var4._M_node;
  local_2c0 = uVar5;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff990);
  it.super_iterator.pos = (pointer)uStack_300;
  it.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_308;
  it.super_iterator.end = local_2f8;
  it.parent_ = pBStack_2f0;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(&local_2e8,it);
  local_318 = (_Base_ptr)local_2e8.super_const_iterator.end;
  pBStack_310 = local_2e8.parent_;
  local_328 = local_2e8.super_const_iterator.ht;
  pHStack_320 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)local_2e8.super_const_iterator.pos;
  std::
  advance<google::BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator,int>
            (in_stack_fffffffffffff970,iVar8);
  local_338 = (_Base_ptr)local_2e8.super_const_iterator.end;
  pBStack_330 = local_2e8.parent_;
  local_348 = local_2e8.super_const_iterator.ht;
  pHStack_340 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)local_2e8.super_const_iterator.pos;
  local_358 = local_318;
  pBStack_350 = pBStack_310;
  local_368 = local_328;
  pHStack_360 = pHStack_320;
  uVar7 = SUB84(local_2e8.super_const_iterator.ht,0);
  iVar8 = (int)((ulong)local_2e8.super_const_iterator.ht >> 0x20);
  f.super_const_iterator.ht._4_4_ = in_stack_fffffffffffff9d4;
  f.super_const_iterator.ht._0_4_ = in_stack_fffffffffffff9d0;
  f.super_const_iterator.pos._0_4_ = in_stack_fffffffffffff9d8;
  f.super_const_iterator.pos._4_4_ = in_stack_fffffffffffff9dc;
  f.super_const_iterator.end._0_4_ = in_stack_fffffffffffff9e0;
  f.super_const_iterator.end._4_4_ = in_stack_fffffffffffff9e4;
  f.parent_ = in_stack_fffffffffffff9e8;
  l.super_const_iterator.pos._0_7_ = in_stack_fffffffffffff9f8;
  l.super_const_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff9f0;
  l.super_const_iterator.pos._7_1_ = uVar5;
  l.super_const_iterator.end = (pointer)_Var4._M_node;
  l.parent_._0_4_ = vVar2;
  l.parent_._4_4_ = uVar11;
  lhs_expression = local_328;
  __i = pHStack_320;
  p_Var9 = local_318;
  this_01 = pBStack_310;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::
  insert<google::BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
            ((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),f,l);
  type = (Type)((ulong)p_Var9 >> 0x20);
  local_37c = 3;
  local_388 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe4512c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)local_2e8.parent_,
             (uint *)local_2e8.super_const_iterator.end,
             (unsigned_long *)local_2e8.super_const_iterator.pos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
  this_00 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_2e8.super_const_iterator.pos;
  _Var4._M_node = (_Base_ptr)local_2e8.super_const_iterator.end;
  f_00._M_node = (_Base_ptr)local_2e8.parent_;
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xe451ff);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)__i,(int)((ulong)lhs_expression >> 0x20),
               (char *)local_2e8.parent_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)local_2e8.super_const_iterator.pos);
    testing::Message::~Message((Message *)0xe45262);
    this_00 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_2e8.super_const_iterator.pos;
    _Var4._M_node = (_Base_ptr)local_2e8.super_const_iterator.end;
    f_00._M_node = (_Base_ptr)local_2e8.parent_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe452d3);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff990);
  piVar3 = google::
           dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_3d0);
  iVar10 = *piVar3;
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(this_00,iVar8);
  local_3a9 = true;
  if (iVar10 != vVar2) {
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::begin(in_stack_fffffffffffff990);
    piVar3 = google::
             dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator*(&local_3f0);
    in_stack_fffffffffffff9d4 = *piVar3;
    vVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(this_00,iVar8);
    local_3a9 = true;
    if (in_stack_fffffffffffff9d4 != vVar2) {
      google::
      BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::begin(in_stack_fffffffffffff990);
      piVar3 = google::
               dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator*(&local_410);
      in_stack_fffffffffffff9cc = *piVar3;
      in_stack_fffffffffffff9d0 =
           HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(this_00,iVar8);
      local_3a9 = true;
      if (in_stack_fffffffffffff9cc != in_stack_fffffffffffff9d0) {
        google::
        BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::begin(in_stack_fffffffffffff990);
        piVar3 = google::
                 dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::operator*(&local_430);
        in_stack_fffffffffffff9c4 = *piVar3;
        in_stack_fffffffffffff9c8 =
             HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(this_00,iVar8);
        local_3a9 = true;
        if (in_stack_fffffffffffff9c4 != in_stack_fffffffffffff9c8) {
          google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::begin(in_stack_fffffffffffff990);
          piVar3 = google::
                   dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::operator*(&local_450);
          in_stack_fffffffffffff9bc = *piVar3;
          in_stack_fffffffffffff9c0 =
               HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(this_00,iVar8);
          local_3a9 = true;
          if (in_stack_fffffffffffff9bc != in_stack_fffffffffffff9c0) {
            google::
            BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::begin(in_stack_fffffffffffff990);
            piVar3 = google::
                     dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     ::operator*(&local_470);
            in_stack_fffffffffffff9b4 = *piVar3;
            in_stack_fffffffffffff9b8 =
                 HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(this_00,iVar8);
            local_3a9 = in_stack_fffffffffffff9b4 == in_stack_fffffffffffff9b8;
          }
        }
      }
    }
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)CONCAT44(iVar8,uVar7),(type *)0xe45557);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (char *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
               (char *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)__i,(int)((ulong)lhs_expression >> 0x20),
               (char *)f_00._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_4a0);
    testing::Message::~Message((Message *)0xe4562c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe456c3);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_4a8);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_4b0);
  local_4b8 = (_Base_ptr)
              std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar8,uVar7));
  local_4b0._M_node = local_4b8;
  local_4a8._M_node = local_4b8;
  std::advance<std::_Rb_tree_const_iterator<int>,int>
            ((_Rb_tree_const_iterator<int> *)__i,(int)((ulong)lhs_expression >> 0x20));
  local_4c0 = local_4a8._M_node;
  local_4c8 = local_4b0._M_node;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::_Rb_tree_const_iterator<int>>
            ((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)this_00,f_00,_Var4);
  local_4dc = 6;
  local_4e8 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe45787);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)f_00._M_node,&(_Var4._M_node)->_M_color,
             (unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xe4580e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)__i,(int)((ulong)lhs_expression >> 0x20),
               (char *)f_00._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xe4586b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe458dc);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<int_const*>
            ((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)this_00,(int *)CONCAT44(iVar8,uVar7),(int *)0xe458fd);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe4591b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)lhs_expression,(char *)f_00._M_node,&(_Var4._M_node)->_M_color,
             (unsigned_long *)this_00);
  iVar8 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xe459a2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)__i,iVar8,(char *)f_00._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (Message *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0xe459ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe45a6a);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xe45a77);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xe45a84);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}